

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::startDocument(QXmlStreamReaderPrivate *this)

{
  XmlStringRef *this_00;
  QString *pQVar1;
  QStringDecoder *this_01;
  long lVar2;
  Attribute *pAVar3;
  qsizetype qVar4;
  Interface *pIVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  bool bVar8;
  const_pointer pvVar9;
  QXmlUtils *this_02;
  storage_type_conflict *extraout_RDX;
  long lVar10;
  QArrayDataPointer<char16_t> *this_03;
  long lVar11;
  long in_FS_OFFSET;
  QStringView encName;
  QArrayDataPointer<char16_t> local_120;
  QAnyStringView local_108;
  QArrayDataPointer<char16_t> local_f8;
  XmlStringRef local_d8;
  XmlStringRef local_b8;
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_78 [8];
  State SStack_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  this_00 = &this->documentVersion;
  pvVar9 = QtPrivate::XmlStringRef::data(this_00);
  local_78 = (undefined1  [8])QtPrivate::XmlStringRef::size(this_00);
  local_b8.m_string = (QString *)&DAT_00000003;
  local_b8.m_pos = 0x4728b3;
  SStack_70._0_8_ = pvVar9;
  bVar8 = ::operator!=((QStringView *)local_78,(QLatin1StringView *)&local_b8);
  if (bVar8) {
    _local_78 = QtPrivate::XmlStringRef::view(this_00);
    bVar8 = QStringView::contains((QStringView *)local_78,(QChar)0x20,CaseSensitive);
    if (bVar8) {
      QXmlStream::tr((QString *)local_78,"Invalid XML version string.",(char *)0x0,-1);
    }
    else {
      QXmlStream::tr((QString *)local_78,"Unsupported XML version.",(char *)0x0,-1);
    }
    qVar4 = local_98.size;
    pcVar7 = local_98.ptr;
    pDVar6 = local_98.d;
    local_98.d = (Data *)local_78;
    local_98.ptr = (char16_t *)SStack_70._0_8_;
    local_78 = (undefined1  [8])pDVar6;
    SStack_70._0_8_ = pcVar7;
    local_98.size = SStack_70.remainingChars;
    SStack_70.remainingChars = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  }
  lVar2 = (this->attributeStack).tos;
  pQVar1 = &this->textBuffer;
  this_01 = &this->decoder;
  lVar11 = 0x28;
  lVar10 = 0;
  do {
    if (((const_pointer)local_98.ptr != (const_pointer)0x0) || (lVar2 < lVar10)) {
      if ((const_pointer)local_98.ptr != (const_pointer)0x0) {
        raiseWellFormedError(this,(QString *)&local_98);
      }
      (this->attributeStack).tos = -1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    pAVar3 = (this->attributeStack).data;
    local_b8.m_size = (qsizetype)*(short *)((long)pAVar3 + lVar11 + -0x18);
    local_b8.m_pos = *(long *)((long)pAVar3 + lVar11 + -0x28) + local_b8.m_size;
    local_b8.m_size = *(long *)((long)pAVar3 + lVar11 + -0x20) - local_b8.m_size;
    local_d8.m_size = (qsizetype)*(short *)((long)&(pAVar3->key).pos + lVar11);
    local_d8.m_pos = *(long *)((long)pAVar3 + lVar11 + -0x10) + local_d8.m_size;
    local_d8.m_size = *(long *)((long)pAVar3 + lVar11 + -8) - local_d8.m_size;
    local_d8.m_string = pQVar1;
    local_b8.m_string = pQVar1;
    if (*(ushort *)((long)pAVar3 + lVar11 + -0x18) < 2) {
      pvVar9 = QtPrivate::XmlStringRef::data(&local_b8);
      local_78 = (undefined1  [8])QtPrivate::XmlStringRef::size(&local_b8);
      local_f8.d = (Data *)0x8;
      local_f8.ptr = L"encoding";
      SStack_70._0_8_ = pvVar9;
      bVar8 = ::comparesEqual((QLatin1StringView *)&local_f8,(QStringView *)local_78);
      if (bVar8) {
        (this->documentEncoding).m_size = local_d8.m_size;
        (this->documentEncoding).m_string = local_d8.m_string;
        (this->documentEncoding).m_pos = local_d8.m_pos;
        if ((this->field_0x3a9 & 0x20) != 0) {
          QXmlStream::tr((QString *)local_78,
                         "The standalone pseudo attribute must appear after the encoding.",
                         (char *)0x0,-1);
          qVar4 = local_98.size;
          pcVar7 = local_98.ptr;
          pDVar6 = local_98.d;
          local_98.d = (Data *)local_78;
          local_98.ptr = (char16_t *)SStack_70._0_8_;
          local_78 = (undefined1  [8])pDVar6;
          SStack_70._0_8_ = pcVar7;
          local_98.size = SStack_70.remainingChars;
          SStack_70.remainingChars = qVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
        }
        pvVar9 = QtPrivate::XmlStringRef::data(&local_d8);
        this_02 = (QXmlUtils *)QtPrivate::XmlStringRef::size(&local_d8);
        encName.m_data = extraout_RDX;
        encName.m_size = (qsizetype)pvVar9;
        bVar8 = QXmlUtils::isEncName(this_02,encName);
        if (!bVar8) {
          QXmlStream::tr((QString *)&local_f8,"%1 is an invalid encoding name.",(char *)0x0,-1);
          QString::arg<QtPrivate::XmlStringRef,_true>
                    ((QString *)local_78,(QString *)&local_f8,&local_d8,0,(QChar)0x20);
          qVar4 = local_98.size;
          pcVar7 = local_98.ptr;
          pDVar6 = local_98.d;
          local_98.d = (Data *)local_78;
          local_98.ptr = (char16_t *)SStack_70._0_8_;
          local_78 = (undefined1  [8])pDVar6;
          SStack_70._0_8_ = pcVar7;
          local_98.size = SStack_70.remainingChars;
          SStack_70.remainingChars = qVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
          this_03 = &local_f8;
          goto LAB_00351c8a;
        }
        local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::XmlStringRef::toString((QString *)local_78,&local_d8);
        QString::toUtf8_helper((QByteArray *)&local_f8,(QString *)local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
        if ((this->field_0x3a9 & 8) == 0) {
          local_120.d = (Data *)local_f8.ptr;
          if ((QStringDecoder *)local_f8.ptr == (QStringDecoder *)0x0) {
            local_120.d = (Data *)&QByteArray::_empty;
          }
          QAnyStringView::QAnyStringView<const_char_*,_true>(&local_108,(char **)&local_120);
          QStringConverter::QStringConverter((QStringConverter *)local_78,local_108,(Flags)0x0);
          QStringConverter::operator=(&this_01->super_QStringConverter,(QStringConverter *)local_78)
          ;
          QStringConverterBase::State::clear((State *)(local_78 + 8));
          if ((this_01->super_QStringConverter).iface == (Interface *)0x0) {
            QXmlStream::tr((QString *)&local_120,"Encoding %1 is unsupported",(char *)0x0,-1);
            QString::arg<QtPrivate::XmlStringRef,_true>
                      ((QString *)local_78,(QString *)&local_120,&local_d8,0,(QChar)0x20);
            qVar4 = local_98.size;
            pcVar7 = local_98.ptr;
            pDVar6 = local_98.d;
            local_98.d = (Data *)local_78;
            local_98.ptr = (char16_t *)SStack_70._0_8_;
            local_78 = (undefined1  [8])pDVar6;
            SStack_70._0_8_ = pcVar7;
            local_98.size = SStack_70.remainingChars;
            SStack_70.remainingChars = qVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
          }
          else {
            local_120.size = (qsizetype)(this->rawReadBuffer).d.ptr;
            local_120.ptr = (char16_t *)this->nbytesread;
            local_120.d = (Data *)this_01;
            QStringDecoder::EncodedData::operator_cast_to_QString
                      ((QString *)local_78,(EncodedData *)&local_120);
            pIVar5 = (Interface *)(this->readBuffer).d.d;
            pvVar9 = (const_pointer)(this->readBuffer).d.ptr;
            (this->readBuffer).d.d = (Data *)local_78;
            (this->readBuffer).d.ptr = (char16_t *)SStack_70._0_8_;
            qVar4 = (this->readBuffer).d.size;
            (this->readBuffer).d.size = SStack_70.remainingChars;
            SStack_70.remainingChars = qVar4;
            local_78 = (undefined1  [8])pIVar5;
            SStack_70._0_8_ = pvVar9;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78)
            ;
          }
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
      }
      else {
        pvVar9 = QtPrivate::XmlStringRef::data(&local_b8);
        local_78 = (undefined1  [8])QtPrivate::XmlStringRef::size(&local_b8);
        local_f8.d = (Data *)0xa;
        local_f8.ptr = L"standalone";
        SStack_70._0_8_ = pvVar9;
        bVar8 = ::comparesEqual((QLatin1StringView *)&local_f8,(QStringView *)local_78);
        if (!bVar8) goto LAB_00351bed;
        this->field_0x3a9 = this->field_0x3a9 | 0x20;
        pvVar9 = QtPrivate::XmlStringRef::data(&local_d8);
        local_78 = (undefined1  [8])QtPrivate::XmlStringRef::size(&local_d8);
        local_f8.d = (Data *)&DAT_00000003;
        local_f8.ptr = L"yes";
        SStack_70._0_8_ = pvVar9;
        bVar8 = ::comparesEqual((QLatin1StringView *)&local_f8,(QStringView *)local_78);
        if (bVar8) {
          this->field_0x3a8 = this->field_0x3a8 | 8;
        }
        else {
          pvVar9 = QtPrivate::XmlStringRef::data(&local_d8);
          local_78 = (undefined1  [8])QtPrivate::XmlStringRef::size(&local_d8);
          local_f8.d = (Data *)0x2;
          local_f8.ptr = L"no";
          SStack_70._0_8_ = pvVar9;
          bVar8 = ::comparesEqual((QLatin1StringView *)&local_f8,(QStringView *)local_78);
          if (bVar8) {
            this->field_0x3a8 = this->field_0x3a8 & 0xf7;
          }
          else {
            QXmlStream::tr((QString *)local_78,"Standalone accepts only yes or no.",(char *)0x0,-1);
            qVar4 = local_98.size;
            pcVar7 = local_98.ptr;
            pDVar6 = local_98.d;
            local_98.d = (Data *)local_78;
            local_98.ptr = (char16_t *)SStack_70._0_8_;
            local_78 = (undefined1  [8])pDVar6;
            SStack_70._0_8_ = pcVar7;
            local_98.size = SStack_70.remainingChars;
            SStack_70.remainingChars = qVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78)
            ;
          }
        }
      }
    }
    else {
LAB_00351bed:
      QXmlStream::tr((QString *)&local_120,"Invalid attribute in XML declaration: %1 = %2",
                     (char *)0x0,-1);
      QString::arg<QtPrivate::XmlStringRef,_true>
                ((QString *)&local_f8,(QString *)&local_120,&local_b8,0,(QChar)0x20);
      QString::arg<QtPrivate::XmlStringRef,_true>
                ((QString *)local_78,(QString *)&local_f8,&local_d8,0,(QChar)0x20);
      qVar4 = local_98.size;
      pcVar7 = local_98.ptr;
      pDVar6 = local_98.d;
      local_98.d = (Data *)local_78;
      local_98.ptr = (char16_t *)SStack_70._0_8_;
      local_78 = (undefined1  [8])pDVar6;
      SStack_70._0_8_ = pcVar7;
      local_98.size = SStack_70.remainingChars;
      SStack_70.remainingChars = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      this_03 = &local_120;
LAB_00351c8a:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_03);
    }
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 0x30;
  } while( true );
}

Assistant:

void QXmlStreamReaderPrivate::startDocument()
{
    QString err;
    if (documentVersion != "1.0"_L1) {
        if (documentVersion.view().contains(u' '))
            err = QXmlStream::tr("Invalid XML version string.");
        else
            err = QXmlStream::tr("Unsupported XML version.");
    }
    qsizetype n = attributeStack.size();

    /* We use this bool to ensure that the pesudo attributes are in the
     * proper order:
     *
     * [23]     XMLDecl     ::=     '<?xml' VersionInfo EncodingDecl? SDDecl? S? '?>' */

    for (qsizetype i = 0; err.isNull() && i < n; ++i) {
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef key(symString(attrib.key));
        XmlStringRef value(symString(attrib.value));

        if (prefix.isEmpty() && key == "encoding"_L1) {
            documentEncoding = value;

            if (hasStandalone)
                err = QXmlStream::tr("The standalone pseudo attribute must appear after the encoding.");
            if (!QXmlUtils::isEncName(value))
                err = QXmlStream::tr("%1 is an invalid encoding name.").arg(value);
            else {
                QByteArray enc = value.toString().toUtf8();
                if (!lockEncoding) {
                    decoder = QStringDecoder(enc.constData());
                    if (!decoder.isValid()) {
                        err = QXmlStream::tr("Encoding %1 is unsupported").arg(value);
                    } else {
                        readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));
                    }
                }
            }
        } else if (prefix.isEmpty() && key == "standalone"_L1) {
            hasStandalone = true;
            if (value == "yes"_L1)
                standalone = true;
            else if (value == "no"_L1)
                standalone = false;
            else
                err = QXmlStream::tr("Standalone accepts only yes or no.");
        } else {
            err = QXmlStream::tr("Invalid attribute in XML declaration: %1 = %2").arg(key).arg(value);
        }
    }

    if (!err.isNull())
        raiseWellFormedError(err);
    attributeStack.clear();
}